

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O1

LY_ERR lys_compile_iffeature(ly_ctx *ctx,lysp_qname *qname,lysc_iffeature *iff)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  ushort *puVar4;
  lysp_feature **pplVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  ushort **ppuVar9;
  long *plVar10;
  uint8_t *puVar11;
  lysp_feature *plVar12;
  undefined8 uVar13;
  ulong uVar14;
  char *pcVar15;
  char *pcVar16;
  LY_ERR LVar17;
  size_t sVar18;
  uint8_t value;
  char *pcVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  bool bVar25;
  long local_a8;
  iff_stack local_78;
  long local_58;
  ushort **local_50;
  long local_48;
  undefined8 local_40;
  ulong local_38;
  
  pcVar19 = qname->str;
  local_78.size = 0;
  local_78.index = 0;
  local_78.stack = (uint8_t *)0x0;
  if (pcVar19 == (char *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_features.c"
                  ,0x146,
                  "LY_ERR lys_compile_iffeature(const struct ly_ctx *, const struct lysp_qname *, struct lysc_iffeature *)"
                 );
  }
  local_58 = 1;
  uVar23 = 0;
  lVar8 = 0;
  bVar6 = false;
  uVar13 = 0;
  local_a8 = 0;
  uVar20 = 0;
  do {
    cVar1 = pcVar19[uVar23];
    if (cVar1 == '(') {
      lVar8 = lVar8 + 1;
      uVar13 = CONCAT71((int7)((ulong)uVar13 >> 8),1);
    }
    else if (cVar1 == ')') {
      lVar8 = lVar8 + -1;
    }
    else {
      if (cVar1 == '\0') break;
      local_48 = lVar8;
      local_40 = uVar13;
      ppuVar9 = __ctype_b_loc();
      puVar4 = *ppuVar9;
      if ((*(byte *)((long)puVar4 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
        pcVar15 = pcVar19 + uVar23;
        local_50 = ppuVar9;
        local_38 = uVar20;
        iVar7 = strncmp(pcVar15,"not",3);
        lVar8 = 3;
        if ((iVar7 == 0) || (iVar7 = strncmp(pcVar15,"and",3), iVar7 == 0)) {
LAB_00155dff:
          uVar20 = local_38;
          lVar24 = local_58;
          uVar21 = lVar8 + uVar23;
          bVar25 = (long)pcVar19[uVar21] == 0;
          if (bVar25) {
LAB_00155e4d:
            bVar25 = false;
            ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid value \"%s\" of if-feature - unexpected end of expression.",qname->str)
            ;
            uVar21 = uVar23;
            lVar24 = local_58;
          }
          else {
            if ((*(byte *)((long)puVar4 + (long)pcVar19[uVar21] * 2 + 1) & 0x20) != 0) {
              pcVar16 = pcVar19 + uVar21 + 1;
              do {
                cVar2 = *pcVar16;
                bVar25 = (long)cVar2 == 0;
                if (bVar25) goto LAB_00155e4d;
                pcVar16 = pcVar16 + 1;
              } while ((*(byte *)((long)puVar4 + (long)cVar2 * 2 + 1) & 0x20) != 0);
            }
            if (bVar25) goto LAB_00155e4d;
            if ((*(byte *)((long)puVar4 + (long)pcVar19[uVar21] * 2 + 1) & 0x20) == 0) {
              local_a8 = local_a8 + 1;
              bVar6 = false;
LAB_00155f17:
              bVar25 = true;
            }
            else {
              if (cVar1 == 'n') {
                bVar6 = !bVar6;
                if (!bVar6) {
                  uVar20 = local_38 - 2;
                }
                goto LAB_00155f17;
              }
              if (local_58 == local_a8) {
                bVar25 = true;
                bVar6 = false;
                lVar24 = local_58 + 1;
              }
              else {
                bVar25 = false;
                ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid value \"%s\" of if-feature - missing feature/expression before \"%.*s\" operation."
                        ,qname->str,lVar8,pcVar15);
                uVar21 = uVar23;
              }
            }
          }
          if (!bVar25) {
            return LY_EVALID;
          }
        }
        else {
          iVar7 = strncmp(pcVar15,"or",2);
          if (iVar7 == 0) {
            lVar8 = 2;
            goto LAB_00155dff;
          }
          local_a8 = local_a8 + 1;
          bVar6 = false;
          uVar20 = local_38;
          uVar21 = uVar23;
          lVar24 = local_58;
        }
        uVar20 = uVar20 + 1;
        uVar14 = (ulong)pcVar19[uVar21];
        bVar3 = *(byte *)((long)*local_50 + uVar14 * 2 + 1);
        uVar23 = uVar21;
        while (lVar8 = local_48, uVar13 = local_40, local_58 = lVar24, (bVar3 & 0x20) == 0) {
          if (((byte)uVar14 < 0x2a) && ((0x30000000001U >> (uVar14 & 0x3f) & 1) != 0)) {
            uVar23 = uVar23 - 1;
            break;
          }
          uVar14 = (ulong)pcVar19[uVar23 + 1];
          uVar23 = uVar23 + 1;
          bVar3 = *(byte *)((long)*local_50 + uVar14 * 2 + 1);
        }
      }
      else {
        lVar8 = local_48;
        uVar13 = CONCAT71((int7)((ulong)uVar13 >> 8),1);
      }
    }
    uVar23 = uVar23 + 1;
  } while( true );
  if (lVar8 == 0) {
    if (local_58 == local_a8) {
      if ((((char)uVar13 == '\0') && (uVar20 < 2)) || (qname->mod->version == '\x02')) {
        pplVar5 = iff->features;
        if (pplVar5 == (lysp_feature **)0x0) {
          plVar10 = (long *)calloc(1,local_a8 * 8 + 8);
        }
        else {
          plVar10 = (long *)realloc(pplVar5 + -1,((long)&pplVar5[-1]->name + local_a8) * 8 + 8);
        }
        if (plVar10 == (long *)0x0) {
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_iffeature");
          return LY_EMEM;
        }
        iff->features = (lysp_feature **)(plVar10 + 1);
        memset(plVar10 + *plVar10 + 1,0,local_a8 * 8);
        puVar11 = (uint8_t *)calloc(((uVar20 >> 2) + 1) - (ulong)((uVar20 & 3) == 0),1);
        iff->expr = puVar11;
        local_78.stack = (uint8_t *)malloc(uVar20);
        if (puVar11 == (uint8_t *)0x0 || local_78.stack == (uint8_t *)0x0) {
          bVar6 = false;
          LVar17 = LY_EMEM;
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_iffeature");
        }
        else {
          local_a8 = local_a8 + -1;
          uVar21 = uVar20 - 1;
          local_78.size = uVar20;
          sVar18 = local_78.index;
joined_r0x00156132:
          uVar20 = uVar23;
          puVar11 = local_78.stack;
          local_78.index = sVar18;
          local_78.stack = puVar11;
          if (0 < (long)uVar20) {
            uVar23 = uVar20 - 1;
            cVar1 = pcVar19[uVar20 - 1];
            if (cVar1 == ')') {
              iff_stack_push(&local_78,'\b');
              sVar18 = local_78.index;
            }
            else if (cVar1 == '(') {
              if (sVar18 == 0) {
LAB_00156518:
                local_78.index = sVar18;
                __assert_fail("stack && stack->index",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_features.c"
                              ,0x111,"uint8_t iff_stack_pop(struct iff_stack *)");
              }
              while( true ) {
                sVar18 = sVar18 - 1;
                if (puVar11[sVar18] == '\b') break;
                iff_setop(iff->expr,puVar11[sVar18],uVar21);
                uVar21 = uVar21 - 1;
                if (sVar18 == 0) {
                  sVar18 = 0;
                  goto LAB_00156518;
                }
              }
            }
            else {
              ppuVar9 = __ctype_b_loc();
              puVar4 = *ppuVar9;
              sVar18 = local_78.index;
              if ((*(byte *)((long)puVar4 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
                uVar14 = uVar23;
                do {
                  uVar22 = uVar14;
                  if (((long)pcVar19[uVar14] == 0x28) || ((puVar4[pcVar19[uVar14]] & 0x2000) != 0))
                  break;
                  bVar6 = 0 < (long)uVar14;
                  uVar22 = ((long)uVar23 >> 0x3f & uVar23) - 1;
                  uVar14 = uVar14 - 1;
                } while (bVar6);
                uVar23 = uVar22 + 1;
                pcVar15 = pcVar19 + uVar22 + 1;
                iVar7 = strncmp(pcVar15,"not",3);
                if ((iVar7 == 0) &&
                   ((*(byte *)((long)puVar4 + (long)pcVar19[uVar22 + 4] * 2 + 1) & 0x20) != 0)) {
                  if ((local_78.index == 0) || (local_78.stack[local_78.index - 1] != '\0')) {
                    iff_stack_push(&local_78,'\0');
                    sVar18 = local_78.index;
                  }
                  else {
                    sVar18 = local_78.index - 1;
                  }
                  goto joined_r0x00156132;
                }
                iVar7 = strncmp(pcVar15,"and",3);
                puVar11 = local_78.stack;
                if ((iVar7 == 0) &&
                   ((*(byte *)((long)puVar4 + (long)pcVar19[uVar22 + 4] * 2 + 1) & 0x20) != 0)) {
                  sVar18 = local_78.index;
                  if (local_78.index != 0) {
                    do {
                      if (1 < puVar11[sVar18 - 1]) goto LAB_001563d9;
                      uVar20 = uVar21 - 1;
                      iff_setop(iff->expr,puVar11[sVar18 - 1],uVar21);
                      sVar18 = sVar18 - 1;
                      uVar21 = uVar20;
                    } while (sVar18 != 0);
                    sVar18 = 0;
                  }
LAB_001563d9:
                  value = '\x01';
                  local_78.index = sVar18;
                }
                else {
                  iVar7 = strncmp(pcVar15,"or",2);
                  puVar11 = local_78.stack;
                  if ((iVar7 != 0) ||
                     ((*(byte *)((long)puVar4 + (long)pcVar19[uVar22 + 3] * 2 + 1) & 0x20) == 0)) {
                    iff->expr[uVar21 >> 2] =
                         iff->expr[uVar21 >> 2] | '\x03' << ((char)uVar21 * '\x02' & 6U);
                    plVar12 = lysp_feature_find(qname->mod,pcVar15,uVar20 - uVar23,'\x01');
                    if (plVar12 == (lysp_feature *)0x0) {
                      bVar6 = false;
                      ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                              "Invalid value \"%s\" of if-feature - unable to find feature \"%.*s\"."
                              ,qname->str,uVar20 - uVar23 & 0xffffffff,pcVar15);
                      LVar17 = LY_EVALID;
                      goto LAB_0015649f;
                    }
                    uVar21 = uVar21 - 1;
                    iff->features[local_a8] = plVar12;
                    iff->features[-1] = (lysp_feature *)((long)&iff->features[-1]->name + 1);
                    local_a8 = local_a8 + -1;
                    sVar18 = local_78.index;
                    goto joined_r0x00156132;
                  }
                  sVar18 = local_78.index;
                  if (local_78.index != 0) {
                    do {
                      if (2 < puVar11[sVar18 - 1]) goto LAB_001563f0;
                      uVar20 = uVar21 - 1;
                      iff_setop(iff->expr,puVar11[sVar18 - 1],uVar21);
                      sVar18 = sVar18 - 1;
                      uVar21 = uVar20;
                    } while (sVar18 != 0);
                    sVar18 = 0;
                  }
LAB_001563f0:
                  value = '\x02';
                  local_78.index = sVar18;
                }
                iff_stack_push(&local_78,value);
                sVar18 = local_78.index;
              }
            }
            goto joined_r0x00156132;
          }
          for (; sVar18 != 0; sVar18 = sVar18 - 1) {
            iff_setop(iff->expr,puVar11[sVar18 - 1],uVar21);
            uVar21 = uVar21 - 1;
          }
          local_78.index = 0;
          if ((uVar21 == 0xffffffffffffffff) && (local_a8 == -1)) {
            LVar17 = LY_SUCCESS;
            bVar6 = true;
          }
          else {
            bVar6 = false;
            ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid value \"%s\" of if-feature - processing error.",qname->str);
            LVar17 = LY_EINT;
          }
        }
LAB_0015649f:
        if (!bVar6) {
          if (iff->features != (lysp_feature **)0x0) {
            free(iff->features + -1);
          }
          iff->features = (lysp_feature **)0x0;
          free(iff->expr);
          iff->expr = (uint8_t *)0x0;
        }
        local_78.size = 0;
        free(local_78.stack);
        return LVar17;
      }
      pcVar19 = qname->str;
      pcVar15 = "Invalid value \"%s\" of if-feature - YANG 1.1 expression in YANG 1.0 module.";
    }
    else {
      pcVar19 = qname->str;
      pcVar15 = 
      "Invalid value \"%s\" of if-feature - number of features in expression does not match the required number of operands for the operations."
      ;
    }
  }
  else {
    pcVar19 = qname->str;
    pcVar15 = "Invalid value \"%s\" of if-feature - non-matching opening and closing parentheses.";
  }
  ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,pcVar15,pcVar19);
  return LY_EVALID;
}

Assistant:

static LY_ERR
lys_compile_iffeature(const struct ly_ctx *ctx, const struct lysp_qname *qname, struct lysc_iffeature *iff)
{
    LY_ERR rc = LY_SUCCESS;
    const char *c = qname->str;
    int64_t i, j;
    int8_t op_len, last_not = 0, checkversion = 0;
    LY_ARRAY_COUNT_TYPE f_size = 0, expr_size = 0, f_exp = 1;
    uint8_t op;
    struct iff_stack stack = {0, 0, NULL};
    struct lysp_feature *f;

    assert(c);

    /* pre-parse the expression to get sizes for arrays, also do some syntax checks of the expression */
    for (i = j = 0; c[i]; i++) {
        if (c[i] == '(') {
            j++;
            checkversion = 1;
            continue;
        } else if (c[i] == ')') {
            j--;
            continue;
        } else if (isspace(c[i])) {
            checkversion = 1;
            continue;
        }

        if (!strncmp(&c[i], "not", op_len = ly_strlen_const("not")) ||
                !strncmp(&c[i], "and", op_len = ly_strlen_const("and")) ||
                !strncmp(&c[i], "or", op_len = ly_strlen_const("or"))) {
            uint64_t spaces;

            for (spaces = 0; c[i + op_len + spaces] && isspace(c[i + op_len + spaces]); spaces++) {}
            if (c[i + op_len + spaces] == '\0') {
                LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - unexpected end of expression.", qname->str);
                return LY_EVALID;
            } else if (!isspace(c[i + op_len])) {
                /* feature name starting with the not/and/or */
                last_not = 0;
                f_size++;
            } else if (c[i] == 'n') { /* not operation */
                if (last_not) {
                    /* double not */
                    expr_size = expr_size - 2;
                    last_not = 0;
                } else {
                    last_not = 1;
                }
            } else { /* and, or */
                if (f_exp != f_size) {
                    LOGVAL(ctx, LYVE_SYNTAX_YANG,
                            "Invalid value \"%s\" of if-feature - missing feature/expression before \"%.*s\" operation.",
                            qname->str, op_len, &c[i]);
                    return LY_EVALID;
                }
                f_exp++;

                /* not a not operation */
                last_not = 0;
            }
            i += op_len;
        } else {
            f_size++;
            last_not = 0;
        }
        expr_size++;

        while (!isspace(c[i])) {
            if (!c[i] || (c[i] == ')') || (c[i] == '(')) {
                i--;
                break;
            }
            i++;
        }
    }
    if (j) {
        /* not matching count of ( and ) */
        LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - non-matching opening and closing parentheses.",
                qname->str);
        return LY_EVALID;
    }
    if (f_exp != f_size) {
        /* features do not match the needed arguments for the logical operations */
        LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - number of features in expression does not match "
                "the required number of operands for the operations.", qname->str);
        return LY_EVALID;
    }

    if (checkversion || (expr_size > 1)) {
        /* check that we have 1.1 module */
        if (qname->mod->version != LYS_VERSION_1_1) {
            LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - YANG 1.1 expression in YANG 1.0 module.",
                    qname->str);
            return LY_EVALID;
        }
    }

    /* allocate the memory */
    LY_ARRAY_CREATE_RET(ctx, iff->features, f_size, LY_EMEM);
    iff->expr = calloc((j = (expr_size / IFF_RECORDS_IN_BYTE) + ((expr_size % IFF_RECORDS_IN_BYTE) ? 1 : 0)), sizeof *iff->expr);
    stack.stack = malloc(expr_size * sizeof *stack.stack);
    LY_CHECK_ERR_GOTO(!stack.stack || !iff->expr, LOGMEM(ctx); rc = LY_EMEM, cleanup);

    stack.size = expr_size;
    f_size--; expr_size--; /* used as indexes from now */

    for (i--; i >= 0; i--) {
        if (c[i] == ')') {
            /* push it on stack */
            iff_stack_push(&stack, LYS_IFF_RP);
            continue;
        } else if (c[i] == '(') {
            /* pop from the stack into result all operators until ) */
            while ((op = iff_stack_pop(&stack)) != LYS_IFF_RP) {
                iff_setop(iff->expr, op, expr_size--);
            }
            continue;
        } else if (isspace(c[i])) {
            continue;
        }

        /* end of operator or operand -> find beginning and get what is it */
        j = i + 1;
        while (i >= 0 && !isspace(c[i]) && c[i] != '(') {
            i--;
        }
        i++; /* go back by one step */

        if (!strncmp(&c[i], "not", ly_strlen_const("not")) && isspace(c[i + ly_strlen_const("not")])) {
            if (stack.index && (stack.stack[stack.index - 1] == LYS_IFF_NOT)) {
                /* double not */
                iff_stack_pop(&stack);
            } else {
                /* not has the highest priority, so do not pop from the stack
                 * as in case of AND and OR */
                iff_stack_push(&stack, LYS_IFF_NOT);
            }
        } else if (!strncmp(&c[i], "and", ly_strlen_const("and")) && isspace(c[i + ly_strlen_const("and")])) {
            /* as for OR - pop from the stack all operators with the same or higher
             * priority and store them to the result, then push the AND to the stack */
            while (stack.index && stack.stack[stack.index - 1] <= LYS_IFF_AND) {
                op = iff_stack_pop(&stack);
                iff_setop(iff->expr, op, expr_size--);
            }
            iff_stack_push(&stack, LYS_IFF_AND);
        } else if (!strncmp(&c[i], "or", 2) && isspace(c[i + 2])) {
            while (stack.index && stack.stack[stack.index - 1] <= LYS_IFF_OR) {
                op = iff_stack_pop(&stack);
                iff_setop(iff->expr, op, expr_size--);
            }
            iff_stack_push(&stack, LYS_IFF_OR);
        } else {
            /* feature name, length is j - i */

            /* add it to the expression */
            iff_setop(iff->expr, LYS_IFF_F, expr_size--);

            /* now get the link to the feature definition */
            f = lysp_feature_find(qname->mod, &c[i], j - i, 1);
            if (!f) {
                LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - unable to find feature \"%.*s\".",
                        qname->str, (int)(j - i), &c[i]);
                rc = LY_EVALID;
                goto cleanup;
            }
            iff->features[f_size] = f;
            LY_ARRAY_INCREMENT(iff->features);
            f_size--;
        }
    }
    while (stack.index) {
        op = iff_stack_pop(&stack);
        iff_setop(iff->expr, op, expr_size--);
    }

    if (++expr_size || ++f_size) {
        /* not all expected operators and operands found */
        LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - processing error.", qname->str);
        rc = LY_EINT;
    }

cleanup:
    if (rc) {
        LY_ARRAY_FREE(iff->features);
        iff->features = NULL;
        free(iff->expr);
        iff->expr = NULL;
    }
    iff_stack_clean(&stack);
    return rc;
}